

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConfigureFileCommand.cxx
# Opt level: O2

int __thiscall cmConfigureFileCommand::ConfigureFile(cmConfigureFileCommand *this)

{
  int iVar1;
  
  iVar1 = cmMakefile::ConfigureFile
                    ((this->super_cmCommand).Makefile,(this->InputFile)._M_dataplus._M_p,
                     (this->OutputFile)._M_dataplus._M_p,this->CopyOnly,this->AtOnly,
                     this->EscapeQuotes,&this->NewLineStyle);
  return iVar1;
}

Assistant:

int cmConfigureFileCommand::ConfigureFile()
{
  return this->Makefile->ConfigureFile(
    this->InputFile.c_str(),
    this->OutputFile.c_str(),
    this->CopyOnly,
    this->AtOnly,
    this->EscapeQuotes,
    this->NewLineStyle);
}